

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

size_t __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::ByteSizeLong
          (CodeGeneratorResponse_File *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  size_t sVar6;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 0xf) == 0) {
    sVar6 = 0;
  }
  else {
    if ((uVar3 & 1) == 0) {
      sVar6 = 0;
    }
    else {
      lVar1 = *(long *)(((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 2) != 0) {
      lVar1 = *(long *)(((ulong)(this->insertion_point_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8)
      ;
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 4) != 0) {
      lVar1 = *(long *)(((ulong)(this->content_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
      uVar5 = (uint)lVar1 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar3 & 8) != 0) {
      sVar4 = GeneratedCodeInfo::ByteSizeLong(this->generated_code_info_);
      uVar3 = (uint)sVar4 | 1;
      iVar2 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar6 = sVar6 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar6,&this->_cached_size_);
  return sVar6;
}

Assistant:

size_t CodeGeneratorResponse_File::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string insertion_point = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_insertion_point());
    }

    // optional string content = 15;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_content());
    }

    // optional .google.protobuf.GeneratedCodeInfo generated_code_info = 16;
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *generated_code_info_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}